

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_glob.c
# Opt level: O2

void glob_init(void)

{
  undefined8 in_RAX;
  t_symbol *ptVar1;
  _class *p_Var2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("max");
  maxclass = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  class_addanything(maxclass,max_default);
  ptVar1 = gensym("max");
  pd_bind(&maxclass,ptVar1);
  ptVar1 = gensym("pd");
  p_Var2 = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,8,0,A_NULL);
  glob_pdobject = p_Var2;
  ptVar1 = gensym("init");
  class_addmethod(p_Var2,glob_initfromgui,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("menunew");
  class_addmethod(p_Var2,glob_menunew,ptVar1,A_SYMBOL,2,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("open");
  class_addmethod(p_Var2,glob_open,ptVar1,A_SYMBOL,2,6,(ulong)uVar3 << 0x20);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("quit");
  class_addmethod(p_Var2,glob_exit,ptVar1,A_DEFFLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("verifyquit");
  class_addmethod(p_Var2,glob_verifyquit,ptVar1,A_DEFFLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("foo");
  class_addmethod(p_Var2,glob_foo,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,glob_dsp,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("key");
  class_addmethod(p_Var2,glob_key,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("audiostatus");
  class_addmethod(p_Var2,glob_audiostatus,ptVar1,A_NULL);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("finderror");
  class_addmethod(p_Var2,glob_finderror,ptVar1,A_NULL);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("findinstance");
  class_addmethod(p_Var2,glob_findinstance,ptVar1,A_SYMBOL,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("audio-properties");
  class_addmethod(p_Var2,glob_audio_properties,ptVar1,A_DEFFLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("audio-dialog");
  class_addmethod(p_Var2,glob_audio_dialog,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("audio-setapi");
  class_addmethod(p_Var2,glob_audio_setapi,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("midi-setapi");
  class_addmethod(p_Var2,glob_midi_setapi,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("midi-properties");
  class_addmethod(p_Var2,glob_midi_properties,ptVar1,A_DEFFLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("midi-dialog");
  class_addmethod(p_Var2,glob_midi_dialog,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("start-path-dialog");
  class_addmethod(p_Var2,glob_start_path_dialog,ptVar1,A_NULL);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("path-dialog");
  class_addmethod(p_Var2,glob_path_dialog,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("add-to-path");
  class_addmethod(p_Var2,glob_addtopath,ptVar1,A_SYMBOL,6,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("start-startup-dialog");
  class_addmethod(p_Var2,glob_start_startup_dialog,ptVar1,A_NULL);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("startup-dialog");
  class_addmethod(p_Var2,glob_startup_dialog,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("ping");
  class_addmethod(p_Var2,glob_ping,ptVar1,A_NULL);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("load-preferences");
  class_addmethod(p_Var2,glob_loadpreferences,ptVar1,A_DEFSYM,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("save-preferences");
  class_addmethod(p_Var2,glob_savepreferences,ptVar1,A_DEFSYM,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("forget-preferences");
  class_addmethod(p_Var2,glob_forgetpreferences,ptVar1,A_DEFSYM,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("zoom-open");
  class_addmethod(p_Var2,glob_zoom_open,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("version");
  class_addmethod(p_Var2,glob_version,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("perf");
  class_addmethod(p_Var2,glob_perf,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("compatibility");
  class_addmethod(p_Var2,glob_compatibility,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("plugin-dispatch");
  class_addmethod(p_Var2,glob_plugindispatch,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("help-intro");
  class_addmethod(p_Var2,glob_helpintro,ptVar1,A_GIMME,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("fast-forward");
  class_addmethod(p_Var2,glob_fastforward,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("set-tracing");
  class_addmethod(p_Var2,glob_settracing,ptVar1,A_FLOAT,0);
  p_Var2 = glob_pdobject;
  ptVar1 = gensym("watchdog");
  class_addmethod(p_Var2,glob_watchdog,ptVar1,A_NULL);
  class_addanything(glob_pdobject,max_default);
  ptVar1 = gensym("pd");
  pd_bind(&glob_pdobject,ptVar1);
  return;
}

Assistant:

void glob_init(void)
{
    maxclass = class_new(gensym("max"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    class_addanything(maxclass, max_default);
    pd_bind(&maxclass, gensym("max"));

    glob_pdobject = class_new(gensym("pd"), 0, 0, sizeof(t_pd),
        CLASS_DEFAULT, A_NULL);
    class_addmethod(glob_pdobject, (t_method)glob_initfromgui, gensym("init"),
        A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_menunew, gensym("menunew"),
        A_SYMBOL, A_SYMBOL, 0);
    class_addmethod(glob_pdobject, (t_method)glob_open, gensym("open"),
        A_SYMBOL, A_SYMBOL, A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_exit, gensym("quit"), A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_verifyquit,
        gensym("verifyquit"), A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_foo, gensym("foo"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_dsp, gensym("dsp"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_key, gensym("key"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_audiostatus,
        gensym("audiostatus"), 0);
    class_addmethod(glob_pdobject, (t_method)glob_finderror,
        gensym("finderror"), 0);
    class_addmethod(glob_pdobject, (t_method)glob_findinstance,
        gensym("findinstance"), A_SYMBOL, 0);
    class_addmethod(glob_pdobject, (t_method)glob_audio_properties,
        gensym("audio-properties"), A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_audio_dialog,
        gensym("audio-dialog"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_audio_setapi,
        gensym("audio-setapi"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_midi_setapi,
        gensym("midi-setapi"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_midi_properties,
        gensym("midi-properties"), A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_midi_dialog,
        gensym("midi-dialog"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_start_path_dialog,
        gensym("start-path-dialog"), 0);
    class_addmethod(glob_pdobject, (t_method)glob_path_dialog,
        gensym("path-dialog"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_addtopath,
        gensym("add-to-path"), A_SYMBOL, A_DEFFLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_start_startup_dialog,
        gensym("start-startup-dialog"), 0);
    class_addmethod(glob_pdobject, (t_method)glob_startup_dialog,
        gensym("startup-dialog"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_ping, gensym("ping"), 0);
    class_addmethod(glob_pdobject, (t_method)glob_loadpreferences,
        gensym("load-preferences"), A_DEFSYM, 0);
    class_addmethod(glob_pdobject, (t_method)glob_savepreferences,
        gensym("save-preferences"), A_DEFSYM, 0);
    class_addmethod(glob_pdobject, (t_method)glob_forgetpreferences,
        gensym("forget-preferences"), A_DEFSYM, 0);
    class_addmethod(glob_pdobject, (t_method)glob_zoom_open,
        gensym("zoom-open"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_version,
        gensym("version"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_perf,
        gensym("perf"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_compatibility,
        gensym("compatibility"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_plugindispatch,
        gensym("plugin-dispatch"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_helpintro,
        gensym("help-intro"), A_GIMME, 0);
    class_addmethod(glob_pdobject, (t_method)glob_fastforward,
         gensym("fast-forward"), A_FLOAT, 0);
    class_addmethod(glob_pdobject, (t_method)glob_settracing,
         gensym("set-tracing"), A_FLOAT, 0);
#if defined(__linux__) || defined(__FreeBSD_kernel__)
    class_addmethod(glob_pdobject, (t_method)glob_watchdog,
        gensym("watchdog"), 0);
#endif
    class_addanything(glob_pdobject, max_default);
    pd_bind(&glob_pdobject, gensym("pd"));
}